

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O0

TGet * __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::GetTGet
          (MultiAgentDecisionProcessDiscreteFactoredStates *this)

{
  TGet_TransitionModelMappingSparse *in_RDI;
  TransitionModelMappingSparse *in_stack_ffffffffffffffe8;
  TGet *local_8;
  
  if (((ulong)in_RDI[0x12].super_TGet._vptr_TGet & 1) == 0) {
    local_8 = (TGet *)0x0;
  }
  else if (((ulong)in_RDI[0x12].super_TGet._vptr_TGet & 0x100) == 0) {
    local_8 = (TGet *)operator_new(0x20);
    TGet_TransitionModelMapping::TGet_TransitionModelMapping
              ((TGet_TransitionModelMapping *)in_RDI,
               (TransitionModelMapping *)in_stack_ffffffffffffffe8);
  }
  else {
    local_8 = (TGet *)operator_new(0x20);
    TGet_TransitionModelMappingSparse::TGet_TransitionModelMappingSparse
              (in_RDI,in_stack_ffffffffffffffe8);
  }
  return local_8;
}

Assistant:

TGet* MultiAgentDecisionProcessDiscreteFactoredStates::
GetTGet() const
{    
    if(!_m_cached_FlatTM)
        return 0;

    if(_m_sparse_FlatTM)
        return new TGet_TransitionModelMappingSparse(
                ((TransitionModelMappingSparse*)_m_p_tModel)  ); 
    else
        return new TGet_TransitionModelMapping(
                ((TransitionModelMapping*)_m_p_tModel)  );


}